

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

optional<unsigned_long> find_in_table(token *token,char **table,string_view prefix)

{
  int iVar1;
  _Storage<unsigned_long,_true> unaff_R14;
  ulong uVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  optional<unsigned_long> oVar3;
  token_data local_38;
  string_view prefix_local;
  
  prefix_local._M_str = prefix._M_str;
  prefix_local._M_len = prefix._M_len;
  if (token->type == identifier) {
    local_38 = token->data;
    if (prefix_local._M_len != 0) {
      uVar2 = 0;
      __str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_38.predicate,0,
                         prefix_local._M_len);
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&prefix_local,__str);
      if (iVar1 != 0) goto LAB_00129d90;
      local_38.string =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_38.predicate,
                      prefix_local._M_len,0xffffffffffffffff);
    }
    for (unaff_R14._M_value = 0; table[unaff_R14._M_value] != (char *)0x0;
        unaff_R14._M_value = unaff_R14._M_value + 1) {
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_38.predicate,
                         table[unaff_R14._M_value]);
      if (iVar1 == 0) {
        uVar2 = CONCAT71((int7)((ulong)&local_38 >> 8),1);
        goto LAB_00129d90;
      }
    }
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
  }
LAB_00129d90:
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2 & 0xffffffff;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> find_in_table(const token& token, const char* const* table,
                                      std::string_view prefix)
{
    if (token.type != token_type::identifier) {
        return {};
    }

    std::string_view text = token.data.string;

    if (!prefix.empty()) {
        if (prefix.compare(text.substr(0, std::size(prefix))) != 0) {
            return {};
        }
        text = text.substr(std::size(prefix));
    }

    for (size_t i = 0; table[i]; ++i) {
        if (text.compare(table[i]) != 0) {
            continue;
        }
        return static_cast<uint64_t>(i);
    }
    return {};
}